

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::calcFollowPos(RBBITableBuilder *this,RBBINode *n)

{
  UVector *this_00;
  uint uVar1;
  void *pvVar2;
  uint local_3c;
  uint32_t ix_1;
  RBBINode *i_1;
  UVector *LastPosOfLeftChild;
  uint32_t ix;
  RBBINode *i;
  RBBINode *n_local;
  RBBITableBuilder *this_local;
  
  if (((n != (RBBINode *)0x0) && (n->fType != leafChar)) && (n->fType != endMark)) {
    calcFollowPos(this,n->fLeftChild);
    calcFollowPos(this,n->fRightChild);
    if (n->fType == opCat) {
      this_00 = n->fLeftChild->fLastPosSet;
      for (LastPosOfLeftChild._4_4_ = 0; uVar1 = UVector::size(this_00),
          LastPosOfLeftChild._4_4_ < uVar1; LastPosOfLeftChild._4_4_ = LastPosOfLeftChild._4_4_ + 1)
      {
        pvVar2 = UVector::elementAt(this_00,LastPosOfLeftChild._4_4_);
        setAdd(this,*(UVector **)((long)pvVar2 + 0x98),n->fRightChild->fFirstPosSet);
      }
    }
    if ((n->fType == opStar) || (n->fType == opPlus)) {
      for (local_3c = 0; uVar1 = UVector::size(n->fLastPosSet), local_3c < uVar1;
          local_3c = local_3c + 1) {
        pvVar2 = UVector::elementAt(n->fLastPosSet,local_3c);
        setAdd(this,*(UVector **)((long)pvVar2 + 0x98),n->fFirstPosSet);
      }
    }
  }
  return;
}

Assistant:

void RBBITableBuilder::calcFollowPos(RBBINode *n) {
    if (n == NULL ||
        n->fType == RBBINode::leafChar ||
        n->fType == RBBINode::endMark) {
        return;
    }

    calcFollowPos(n->fLeftChild);
    calcFollowPos(n->fRightChild);

    // Aho rule #1
    if (n->fType == RBBINode::opCat) {
        RBBINode *i;   // is 'i' in Aho's description
        uint32_t     ix;

        UVector *LastPosOfLeftChild = n->fLeftChild->fLastPosSet;

        for (ix=0; ix<(uint32_t)LastPosOfLeftChild->size(); ix++) {
            i = (RBBINode *)LastPosOfLeftChild->elementAt(ix);
            setAdd(i->fFollowPos, n->fRightChild->fFirstPosSet);
        }
    }

    // Aho rule #2
    if (n->fType == RBBINode::opStar ||
        n->fType == RBBINode::opPlus) {
        RBBINode   *i;  // again, n and i are the names from Aho's description.
        uint32_t    ix;

        for (ix=0; ix<(uint32_t)n->fLastPosSet->size(); ix++) {
            i = (RBBINode *)n->fLastPosSet->elementAt(ix);
            setAdd(i->fFollowPos, n->fFirstPosSet);
        }
    }



}